

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_image.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
Bitmap_Operation::generateGrayScalePallete(void)

{
  size_type sVar1;
  uchar *puVar2;
  allocator_type *in_RDI;
  uint8_t i;
  uint8_t *palleteEnd;
  uint8_t *palleteData;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pallete;
  allocator_type *__a;
  value_type_conflict *__value;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  uchar uVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffd0;
  uchar *local_28;
  value_type_conflict local_b [11];
  
  local_b[2] = 0;
  local_b[1] = 0;
  __value = local_b;
  __a = in_RDI;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x10b0ef);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_ffffffffffffffd0,CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8)
             ,__value,__a);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x10b114);
  local_28 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x10b11e);
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__a);
  puVar2 = local_28 + sVar1;
  uVar3 = '\0';
  for (; local_28 != puVar2; local_28 = local_28 + 4) {
    *local_28 = uVar3;
    local_28[1] = uVar3;
    local_28[2] = uVar3;
    uVar3 = uVar3 + '\x01';
  }
  return (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI;
}

Assistant:

std::vector< uint8_t > generateGrayScalePallete()
    {
        std::vector< uint8_t > pallete( 1024u, 0 );

        uint8_t * palleteData = pallete.data();
        uint8_t * palleteEnd = palleteData + pallete.size();

        for( uint8_t i = 0; palleteData != palleteEnd; ++i, ++palleteData ) {
            *palleteData++ = i;
            *palleteData++ = i;
            *palleteData++ = i;
        }

        return pallete;
    }